

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

value_type * __thiscall
toml::result<int,_toml::detail::none_t>::unwrap
          (result<int,_toml::detail::none_t> *this,source_location loc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type_conflict1 *pvVar2;
  string *in_RDI;
  source_location *in_stack_00000148;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  
  bVar1 = is_err((result<int,_toml::detail::none_t> *)in_RDI);
  if (!bVar1) {
    pvVar2 = success<int>::get(&((anon_union_4_2_fd5fb55d_for_result<int,_toml::detail::none_t>_3 *)
                                ((long)&(in_RDI->_M_dataplus)._M_p + 4))->succ_);
    return pvVar2;
  }
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  cxx::to_string_abi_cxx11_(in_stack_00000148);
  std::operator+((char *)in_RDI,__rhs);
  bad_result_access::bad_result_access
            ((bad_result_access *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),in_RDI);
  __cxa_throw(__rhs,&bad_result_access::typeinfo,bad_result_access::~bad_result_access);
}

Assistant:

value_type const& unwrap(cxx::source_location loc = cxx::source_location::current()) const
    {
        if(this->is_err())
        {
            throw bad_result_access("toml::result: bad unwrap" + cxx::to_string(loc));
        }
        return this->succ_.get();
    }